

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipArchiveIOSystem.cpp
# Opt level: O0

size_t __thiscall Assimp::ZipFile::Read(ZipFile *this,void *pvBuffer,size_t pSize,size_t pCount)

{
  bool bVar1;
  pointer puVar2;
  size_t local_38;
  size_t byteSize;
  size_t pCount_local;
  size_t pSize_local;
  void *pvBuffer_local;
  ZipFile *this_local;
  
  bVar1 = std::operator!=(&this->m_Buffer,(nullptr_t)0x0);
  if (!bVar1) {
    __assert_fail("m_Buffer != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/ZipArchiveIOSystem.cpp"
                  ,0xfe,"virtual size_t Assimp::ZipFile::Read(void *, size_t, size_t)");
  }
  bVar1 = false;
  if ((pvBuffer != (void *)0x0) && (bVar1 = false, pSize != 0)) {
    bVar1 = pCount != 0;
  }
  if (bVar1) {
    local_38 = pSize * pCount;
    byteSize = pCount;
    if (this->m_Size < local_38 + this->m_SeekPtr) {
      byteSize = (this->m_Size - this->m_SeekPtr) / pSize;
      local_38 = pSize * byteSize;
      if (local_38 == 0) {
        return 0;
      }
    }
    puVar2 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                       (&this->m_Buffer);
    memcpy(pvBuffer,puVar2 + this->m_SeekPtr,local_38);
    this->m_SeekPtr = local_38 + this->m_SeekPtr;
    return byteSize;
  }
  __assert_fail("__null != pvBuffer && 0 != pSize && 0 != pCount",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/ZipArchiveIOSystem.cpp"
                ,0xff,"virtual size_t Assimp::ZipFile::Read(void *, size_t, size_t)");
}

Assistant:

size_t ZipFile::Read(void* pvBuffer, size_t pSize, size_t pCount) {
        // Should be impossible
        ai_assert(m_Buffer != nullptr);
        ai_assert(NULL != pvBuffer && 0 != pSize && 0 != pCount);

        // Clip down to file size
        size_t byteSize = pSize * pCount;
        if ((byteSize + m_SeekPtr) > m_Size)
        {
            pCount = (m_Size - m_SeekPtr) / pSize;
            byteSize = pSize * pCount;
            if (byteSize == 0)
                return 0;
        }

        std::memcpy(pvBuffer, m_Buffer.get() + m_SeekPtr, byteSize);

        m_SeekPtr += byteSize;

        return pCount;
    }